

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t archive_read_format_zip_options(archive_read *a,char *key,char *val)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  archive_string_conv *paVar4;
  
  pvVar1 = a->format->data;
  iVar2 = strcmp(key,"compat-2x");
  if (iVar2 == 0) {
    *(uint *)((long)pvVar1 + 0x1ee8) = (uint)(val != (char *)0x0);
  }
  else {
    iVar2 = strcmp(key,"hdrcharset");
    if (iVar2 == 0) {
      if ((val == (char *)0x0) || (*val == '\0')) {
        archive_set_error(&a->archive,-1,"zip: hdrcharset option needs a character-set name");
        return L'\xffffffe7';
      }
      paVar4 = archive_string_conversion_from_charset(&a->archive,val,L'\0');
      *(archive_string_conv **)((long)pvVar1 + 0x1ed0) = paVar4;
      if (paVar4 == (archive_string_conv *)0x0) {
        return L'\xffffffe2';
      }
      iVar2 = strcmp(val,"UTF-8");
      if (iVar2 != 0) {
        return L'\0';
      }
      *(archive_string_conv **)((long)pvVar1 + 0x1ee0) = paVar4;
      return L'\0';
    }
    iVar2 = strcmp(key,"ignorecrc32");
    if (iVar2 != 0) {
      iVar2 = strcmp(key,"mac-ext");
      if (iVar2 != 0) {
        return L'\xffffffec';
      }
      uVar3 = 0;
      if (val != (char *)0x0) {
        uVar3 = (uint)(*val != '\0');
      }
      *(uint *)((long)pvVar1 + 0x1eec) = uVar3;
      return L'\0';
    }
    if ((val == (char *)0x0) || (*val == '\0')) {
      *(code **)((long)pvVar1 + 0x98) = real_crc32;
      *(undefined1 *)((long)pvVar1 + 0xa0) = 0;
    }
    else {
      *(code **)((long)pvVar1 + 0x98) = fake_crc32;
      *(undefined1 *)((long)pvVar1 + 0xa0) = 1;
    }
  }
  return L'\0';
}

Assistant:

static int
archive_read_format_zip_options(struct archive_read *a,
    const char *key, const char *val)
{
	struct zip *zip;
	int ret = ARCHIVE_FAILED;

	zip = (struct zip *)(a->format->data);
	if (strcmp(key, "compat-2x")  == 0) {
		/* Handle filenames as libarchive 2.x */
		zip->init_default_conversion = (val != NULL) ? 1 : 0;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "hdrcharset")  == 0) {
		if (val == NULL || val[0] == 0)
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "zip: hdrcharset option needs a character-set name"
			);
		else {
			zip->sconv = archive_string_conversion_from_charset(
			    &a->archive, val, 0);
			if (zip->sconv != NULL) {
				if (strcmp(val, "UTF-8") == 0)
					zip->sconv_utf8 = zip->sconv;
				ret = ARCHIVE_OK;
			} else
				ret = ARCHIVE_FATAL;
		}
		return (ret);
	} else if (strcmp(key, "ignorecrc32") == 0) {
		/* Mostly useful for testing. */
		if (val == NULL || val[0] == 0) {
			zip->crc32func = real_crc32;
			zip->ignore_crc32 = 0;
		} else {
			zip->crc32func = fake_crc32;
			zip->ignore_crc32 = 1;
		}
		return (ARCHIVE_OK);
	} else if (strcmp(key, "mac-ext") == 0) {
		zip->process_mac_extensions = (val != NULL && val[0] != 0);
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}